

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O3

int run_test_tcp_bind6_error_fault(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  void *unaff_RBX;
  uv_loop_t *unaff_R14;
  char garbage [60];
  uv_tcp_t server;
  sockaddr_in6 sStack_3b4;
  undefined1 auStack_398 [272];
  sockaddr_in6 sStack_288;
  sockaddr_in6 sStack_26c;
  uv_tcp_t uStack_250;
  void *pvStack_158;
  uv_loop_t *puStack_150;
  void *local_148;
  char acStack_140 [16];
  void *pvStack_130;
  uv_loop_t *puStack_128;
  uv_handle_type uStack_120;
  undefined4 local_11c;
  undefined4 uStack_118;
  undefined8 uStack_114;
  uv_tcp_t local_108;
  
  uStack_118 = 0x6c622068;
  uStack_114 = 0x68616c62206861;
  puStack_128 = (uv_loop_t *)0x2068616c62206861;
  uStack_120 = 0x68616c62;
  local_11c = 0x616c6220;
  builtin_strncpy(acStack_140 + 8,"lah blah",8);
  pvStack_130 = (void *)0x6c622068616c6220;
  local_148 = (void *)0x616c622068616c62;
  builtin_strncpy(acStack_140,"h blah b",8);
  puStack_150 = (uv_loop_t *)0x16e3c6;
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    puStack_150 = (uv_loop_t *)0x16e46d;
    run_test_tcp_bind6_error_fault_cold_5();
    return 1;
  }
  puStack_150 = (uv_loop_t *)0x16e3d3;
  puVar2 = uv_default_loop();
  puStack_150 = (uv_loop_t *)0x16e3e0;
  iVar1 = uv_tcp_init(puVar2,&local_108);
  if (iVar1 == 0) {
    puStack_150 = (uv_loop_t *)0x16e3f7;
    iVar1 = uv_tcp_bind(&local_108,(sockaddr *)&local_148,0);
    if (iVar1 != -0x16) goto LAB_0016e479;
    puStack_150 = (uv_loop_t *)0x16e40d;
    uv_close((uv_handle_t *)&local_108,close_cb);
    puStack_150 = (uv_loop_t *)0x16e412;
    puVar2 = uv_default_loop();
    unaff_RBX = (void *)0x0;
    puStack_150 = (uv_loop_t *)0x16e41e;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0016e47e;
    puStack_150 = (uv_loop_t *)0x16e42c;
    unaff_R14 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x16e440;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    puStack_150 = (uv_loop_t *)0x16e44a;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    puStack_150 = (uv_loop_t *)0x16e44f;
    puVar2 = uv_default_loop();
    puStack_150 = (uv_loop_t *)0x16e457;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_150 = (uv_loop_t *)0x16e479;
    run_test_tcp_bind6_error_fault_cold_1();
LAB_0016e479:
    puStack_150 = (uv_loop_t *)0x16e47e;
    run_test_tcp_bind6_error_fault_cold_2();
LAB_0016e47e:
    puStack_150 = (uv_loop_t *)0x16e483;
    run_test_tcp_bind6_error_fault_cold_3();
  }
  puStack_150 = (uv_loop_t *)run_test_tcp_bind6_error_inval;
  run_test_tcp_bind6_error_fault_cold_4();
  auStack_398._256_8_ = (uv_handle_t *)0x16e497;
  pvStack_158 = unaff_RBX;
  puStack_150 = unaff_R14;
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    auStack_398._256_8_ = (uv_handle_t *)0x16e599;
    run_test_tcp_bind6_error_inval_cold_8();
    return 1;
  }
  auStack_398._256_8_ = (uv_handle_t *)0x16e4b5;
  iVar1 = uv_ip6_addr("::",0x23a3,&sStack_26c);
  if (iVar1 == 0) {
    auStack_398._256_8_ = (uv_handle_t *)0x16e4d3;
    iVar1 = uv_ip6_addr("::",0x23a4,(sockaddr_in6 *)(auStack_398 + 0x110));
    if (iVar1 != 0) goto LAB_0016e5a5;
    auStack_398._256_8_ = (uv_handle_t *)0x16e4e0;
    puVar2 = uv_default_loop();
    auStack_398._256_8_ = (uv_handle_t *)0x16e4ed;
    iVar1 = uv_tcp_init(puVar2,&uStack_250);
    if (iVar1 != 0) goto LAB_0016e5aa;
    auStack_398._256_8_ = (uv_handle_t *)0x16e506;
    iVar1 = uv_tcp_bind(&uStack_250,(sockaddr *)&sStack_26c,0);
    if (iVar1 != 0) goto LAB_0016e5af;
    auStack_398._256_8_ = (uv_handle_t *)0x16e51f;
    iVar1 = uv_tcp_bind(&uStack_250,(sockaddr *)(auStack_398 + 0x110),0);
    if (iVar1 != -0x16) goto LAB_0016e5b4;
    auStack_398._256_8_ = (uv_handle_t *)0x16e539;
    uv_close((uv_handle_t *)&uStack_250,close_cb);
    auStack_398._256_8_ = (uv_handle_t *)0x16e53e;
    puVar2 = uv_default_loop();
    unaff_RBX = (void *)0x0;
    auStack_398._256_8_ = (uv_handle_t *)0x16e54a;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0016e5b9;
    auStack_398._256_8_ = (uv_handle_t *)0x16e558;
    unaff_R14 = uv_default_loop();
    auStack_398._256_8_ = (uv_handle_t *)0x16e56c;
    uv_walk(unaff_R14,close_walk_cb,(void *)0x0);
    auStack_398._256_8_ = (uv_handle_t *)0x16e576;
    uv_run(unaff_R14,UV_RUN_DEFAULT);
    auStack_398._256_8_ = (uv_handle_t *)0x16e57b;
    puVar2 = uv_default_loop();
    auStack_398._256_8_ = (uv_handle_t *)0x16e583;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    auStack_398._256_8_ = (uv_handle_t *)0x16e5a5;
    run_test_tcp_bind6_error_inval_cold_1();
LAB_0016e5a5:
    auStack_398._256_8_ = (uv_handle_t *)0x16e5aa;
    run_test_tcp_bind6_error_inval_cold_2();
LAB_0016e5aa:
    auStack_398._256_8_ = (uv_handle_t *)0x16e5af;
    run_test_tcp_bind6_error_inval_cold_3();
LAB_0016e5af:
    auStack_398._256_8_ = (uv_handle_t *)0x16e5b4;
    run_test_tcp_bind6_error_inval_cold_4();
LAB_0016e5b4:
    auStack_398._256_8_ = (uv_handle_t *)0x16e5b9;
    run_test_tcp_bind6_error_inval_cold_5();
LAB_0016e5b9:
    auStack_398._256_8_ = (uv_handle_t *)0x16e5be;
    run_test_tcp_bind6_error_inval_cold_6();
  }
  auStack_398._256_8_ = run_test_tcp_bind6_localhost_ok;
  run_test_tcp_bind6_error_inval_cold_7();
  auStack_398._248_8_ = unaff_RBX;
  auStack_398._256_8_ = unaff_R14;
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    run_test_tcp_bind6_localhost_ok_cold_5();
    return 1;
  }
  puVar2 = (uv_loop_t *)0x199c19;
  iVar1 = uv_ip6_addr("::1",0x23a3,&sStack_3b4);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,(uv_tcp_t *)auStack_398);
    if (iVar1 != 0) goto LAB_0016e673;
    puVar2 = (uv_loop_t *)auStack_398;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar2,(sockaddr *)&sStack_3b4,0);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0016e67d;
    }
  }
  else {
    run_test_tcp_bind6_localhost_ok_cold_1();
LAB_0016e673:
    run_test_tcp_bind6_localhost_ok_cold_2();
  }
  run_test_tcp_bind6_localhost_ok_cold_3();
LAB_0016e67d:
  run_test_tcp_bind6_localhost_ok_cold_4();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 == 0) {
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_bind6_error_fault) {
  char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  struct sockaddr_in6* garbage_addr;
  uv_tcp_t server;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  garbage_addr = (struct sockaddr_in6*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server, (const struct sockaddr*) garbage_addr, 0);
  ASSERT(r == UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}